

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O3

void Dam_PrintQue(Dam_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  puts("Divisor queue: ");
  pVVar4 = p->vHash->vObjs;
  iVar5 = pVVar4->nSize;
  if (7 < iVar5) {
    uVar7 = 1;
    do {
      if ((long)iVar5 <= (long)(uVar7 * 4)) {
LAB_00686ca5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      uVar1 = pVVar4->pArray[uVar7 * 4];
      uVar2 = pVVar4->pArray[uVar7 * 4 + 1];
      printf("Div %7d : ",uVar7 & 0xffffffff);
      if ((long)p->vCounts->nSize <= (long)uVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      printf("Weight %9.2f  ",(double)p->vCounts->pArray[uVar7]);
      if ((int)uVar1 < 0) {
LAB_00686c86:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf3,"int Abc_LitIsCompl(int)");
      }
      printf("F = %c%c ",(ulong)(uVar1 & 1 | 0x20),(ulong)((uVar1 >> 1) + 0x60));
      pVVar4 = p->vHash->vObjs;
      if ((long)pVVar4->nSize <= (long)(uVar7 * 4)) goto LAB_00686ca5;
      piVar3 = pVVar4->pArray;
      printf("%c ",(ulong)(piVar3[uVar7 * 4] < piVar3[uVar7 * 4 + 1] ^ 0x2b));
      if ((int)uVar2 < 0) goto LAB_00686c86;
      printf("%c%c   ",(ulong)(uVar2 & 1 | 0x20),(ulong)((uVar2 >> 1) + 0x60));
      putchar(10);
      uVar7 = uVar7 + 1;
      pVVar4 = p->vHash->vObjs;
      iVar5 = pVVar4->nSize;
      iVar6 = iVar5 + 3;
      if (-1 < iVar5) {
        iVar6 = iVar5;
      }
    } while ((long)uVar7 < (long)(iVar6 >> 2));
  }
  return;
}

Assistant:

void Dam_PrintQue( Dam_Man_t * p )
{
    int i;
    printf( "Divisor queue: \n" );
    for ( i = 1; i <= Hash_IntManEntryNum(p->vHash); i++ )
    {
        int iLit0 = Hash_IntObjData0(p->vHash, i);
        int iLit1 = Hash_IntObjData1(p->vHash, i);
        printf( "Div %7d : ",     i );
        printf( "Weight %9.2f  ", Vec_FltEntry(p->vCounts, i) );
        printf( "F = %c%c ",      Abc_LitIsCompl(iLit0) ? '!': ' ', 'a' + Abc_Lit2Var(iLit0)-1 );
        printf( "%c ",            (Hash_IntObjData0(p->vHash, i) < Hash_IntObjData1(p->vHash, i)) ? '*':'+' );
        printf( "%c%c   ",        Abc_LitIsCompl(iLit1) ? '!': ' ', 'a' + Abc_Lit2Var(iLit1)-1 );
        printf( "\n" );
    }
}